

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this)

{
  cmMakefileLibraryTargetGenerator *this_local;
  
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileLibraryTargetGenerator_0149efd8;
  std::__cxx11::string::~string((string *)&this->DeviceLinkObject);
  std::__cxx11::string::~string((string *)&this->FrameworkVersion);
  cmMakefileTargetGenerator::~cmMakefileTargetGenerator(&this->super_cmMakefileTargetGenerator);
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator() =
  default;